

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Error storeAtts(XML_Parser parser,ENCODING *enc,char *attStr,TAG_NAME *tagNamePtr,
                   BINDING **bindingsPtr)

{
  STRING_POOL *pool;
  long lVar1;
  char cVar2;
  undefined1 uVar3;
  DEFAULT_ATTRIBUTE *pDVar4;
  XML_Char *pXVar5;
  uint uVar6;
  int iVar7;
  XML_Error XVar8;
  int iVar9;
  ELEMENT_TYPE *elementType;
  ATTRIBUTE *pAVar10;
  ATTRIBUTE_ID *pAVar11;
  XML_Char *pXVar12;
  NAMED *pNVar13;
  undefined1 *puVar14;
  char *pcVar15;
  char **ppcVar16;
  BINDING *pBVar17;
  undefined8 *puVar18;
  int isCdata;
  long lVar19;
  char *pcVar20;
  int oldAttsSize;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  int local_7c;
  
  if (tagNamePtr == (TAG_NAME *)0x0) {
    uVar22 = 0;
    elementType = (ELEMENT_TYPE *)0x0;
  }
  else {
    elementType = (ELEMENT_TYPE *)lookup((HASH_TABLE *)((long)parser + 0x2b8),tagNamePtr->str,0);
    if (elementType == (ELEMENT_TYPE *)0x0) {
      pXVar12 = poolCopyString((STRING_POOL *)((long)parser + 0x330),tagNamePtr->str);
      tagNamePtr->str = pXVar12;
      if (pXVar12 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      elementType = (ELEMENT_TYPE *)lookup((HASH_TABLE *)((long)parser + 0x2b8),pXVar12,0x28);
      if (elementType == (ELEMENT_TYPE *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      if ((*(int *)((long)parser + 0x1c8) != 0) &&
         (iVar21 = setElementTypePrefix(parser,elementType), iVar21 == 0)) {
        return XML_ERROR_NO_MEMORY;
      }
    }
    uVar22 = (ulong)(uint)elementType->nDefaultAtts;
  }
  uVar6 = (*enc->getAtts)(enc,attStr,*(int *)((long)parser + 0x3f0),
                          *(ATTRIBUTE **)((long)parser + 0x400));
  iVar9 = (int)uVar22;
  iVar21 = *(int *)((long)parser + 0x3f0);
  pAVar10 = *(ATTRIBUTE **)((long)parser + 0x400);
  if (iVar21 < (int)(uVar6 + iVar9)) {
    *(uint *)((long)parser + 0x3f0) = uVar6 + iVar9 + 0x10;
    pAVar10 = (ATTRIBUTE *)(**(code **)((long)parser + 0x20))(pAVar10);
    *(ATTRIBUTE **)((long)parser + 0x400) = pAVar10;
    if (pAVar10 != (ATTRIBUTE *)0x0) {
      if (iVar21 < (int)uVar6) {
        (*enc->getAtts)(enc,attStr,uVar6,pAVar10);
        pAVar10 = *(ATTRIBUTE **)((long)parser + 0x400);
      }
      goto LAB_00150a7a;
    }
LAB_001510dd:
    XVar8 = XML_ERROR_NO_MEMORY;
  }
  else {
LAB_00150a7a:
    if ((int)uVar6 < 1) {
      local_7c = 0;
      iVar21 = 0;
    }
    else {
      uVar23 = 0;
      iVar21 = 0;
      local_7c = 0;
      do {
        lVar19 = uVar23 * 0x20;
        pcVar20 = *(char **)(*(long *)((long)parser + 0x400) + lVar19);
        iVar7 = (*enc->nameLength)(enc,pcVar20);
        pAVar11 = getAttributeId(parser,enc,pcVar20,pcVar20 + iVar7);
        if (pAVar11 == (ATTRIBUTE_ID *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        if (pAVar11->name[-1] != '\0') {
          if (*(ENCODING **)((long)parser + 0x118) != enc) {
            return XML_ERROR_DUPLICATE_ATTRIBUTE;
          }
          *(undefined8 *)((long)parser + 0x218) =
               *(undefined8 *)(*(long *)((long)parser + 0x400) + lVar19);
          return XML_ERROR_DUPLICATE_ATTRIBUTE;
        }
        pAVar11->name[-1] = '\x01';
        iVar7 = iVar21 + 1;
        (&pAVar10->name)[iVar21] = pAVar11->name;
        lVar1 = *(long *)((long)parser + 0x400) + lVar19;
        if (*(char *)(*(long *)((long)parser + 0x400) + 0x18 + lVar19) == '\0') {
          isCdata = 1;
          if ((pAVar11->maybeTokenized != '\0') && (0 < iVar9)) {
            lVar19 = 0;
            do {
              if (pAVar11 == *(ATTRIBUTE_ID **)((long)&elementType->defaultAtts->id + lVar19)) {
                isCdata = (int)(&elementType->defaultAtts->isCdata)[lVar19];
                break;
              }
              lVar19 = lVar19 + 0x18;
            } while (uVar22 * 0x18 != lVar19);
          }
          XVar8 = storeAttributeValue(parser,enc,isCdata,*(char **)(lVar1 + 8),
                                      *(char **)(lVar1 + 0x10),(STRING_POOL *)((long)parser + 0x418)
                                     );
          if (XVar8 != XML_ERROR_NONE) {
            return XVar8;
          }
          if (tagNamePtr != (TAG_NAME *)0x0) {
            (&pAVar10->name)[iVar7] = *(char **)((long)parser + 0x438);
            goto LAB_00150bf9;
          }
          *(char **)((long)parser + 0x430) = *(char **)((long)parser + 0x438);
LAB_00150c53:
          iVar21 = iVar21 + 2;
        }
        else {
          if (tagNamePtr == (TAG_NAME *)0x0) goto LAB_00150c53;
          pXVar12 = poolStoreString((STRING_POOL *)((long)parser + 0x418),enc,*(char **)(lVar1 + 8),
                                    *(char **)(lVar1 + 0x10));
          (&pAVar10->name)[iVar7] = pXVar12;
          if (pXVar12 == (XML_Char *)0x0) goto LAB_001510dd;
LAB_00150bf9:
          *(undefined8 *)((long)parser + 0x438) = *(undefined8 *)((long)parser + 0x430);
          if ((tagNamePtr == (TAG_NAME *)0x0) || (pAVar11->prefix == (PREFIX *)0x0))
          goto LAB_00150c53;
          if (pAVar11->xmlns == '\0') {
            iVar21 = iVar21 + 2;
            local_7c = local_7c + 1;
            pAVar11->name[-1] = '\x02';
          }
          else {
            iVar7 = addBinding(parser,pAVar11->prefix,pAVar11,(&pAVar10->name)[iVar7],bindingsPtr);
            if (iVar7 == 0) {
              return XML_ERROR_NO_MEMORY;
            }
          }
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 != uVar6);
    }
    if (tagNamePtr != (TAG_NAME *)0x0) {
      *(int *)((long)parser + 0x3f4) = iVar21;
      lVar19 = 0xffffffff;
      if ((elementType->idAtt == (ATTRIBUTE_ID *)0x0) ||
         (pcVar20 = elementType->idAtt->name, pcVar20[-1] == '\0')) {
LAB_00150d49:
        *(int *)((long)parser + 0x3f8) = (int)lVar19;
      }
      else if (0 < iVar21) {
        lVar19 = 0;
        do {
          if ((&pAVar10->name)[lVar19] == pcVar20) goto LAB_00150d49;
          lVar19 = lVar19 + 2;
        } while ((int)lVar19 < iVar21);
      }
      if (0 < iVar9) {
        lVar19 = 0;
        do {
          pDVar4 = elementType->defaultAtts;
          pAVar11 = *(ATTRIBUTE_ID **)((long)&pDVar4->id + lVar19);
          pXVar12 = pAVar11->name;
          if ((pXVar12[-1] == '\0') &&
             (pXVar5 = *(XML_Char **)((long)&pDVar4->value + lVar19), pXVar5 != (XML_Char *)0x0)) {
            if (pAVar11->prefix == (PREFIX *)0x0) {
              pXVar12[-1] = '\x01';
            }
            else {
              if (pAVar11->xmlns != '\0') {
                iVar9 = addBinding(parser,pAVar11->prefix,pAVar11,pXVar5,bindingsPtr);
                if (iVar9 != 0) goto LAB_00150d7f;
                goto LAB_001510dd;
              }
              pXVar12[-1] = '\x02';
              local_7c = local_7c + 1;
            }
            (&pAVar10->name)[iVar21] = (char *)**(undefined8 **)((long)&pDVar4->id + lVar19);
            (&pAVar10->valuePtr)[iVar21] = *(char **)((long)&pDVar4->value + lVar19);
            iVar21 = iVar21 + 2;
          }
LAB_00150d7f:
          lVar19 = lVar19 + 0x18;
        } while (uVar22 * 0x18 != lVar19);
      }
      (&pAVar10->name)[iVar21] = (char *)0x0;
    }
    uVar22 = 0;
    if ((local_7c != 0) && (0 < iVar21)) {
      pool = (STRING_POOL *)((long)parser + 0x418);
      uVar22 = 0;
      do {
        cVar2 = (&pAVar10->name)[uVar22][-1];
        (&pAVar10->name)[uVar22][-1] = '\0';
        if (cVar2 == '\x02') {
          pNVar13 = lookup((HASH_TABLE *)((long)parser + 0x2e0),(&pAVar10->name)[uVar22],0);
          puVar18 = *(undefined8 **)(pNVar13[1].name + 8);
          if (puVar18 != (undefined8 *)0x0) {
            pcVar20 = (&pAVar10->name)[uVar22];
            if (0 < *(int *)(puVar18 + 5)) {
              lVar19 = 0;
              do {
                puVar14 = *(undefined1 **)((long)parser + 0x430);
                if (puVar14 == *(undefined1 **)((long)parser + 0x428)) {
                  iVar9 = poolGrow(pool);
                  if (iVar9 == 0) goto LAB_001510dd;
                  puVar14 = *(undefined1 **)((long)parser + 0x430);
                }
                uVar3 = *(undefined1 *)(puVar18[4] + lVar19);
                *(undefined1 **)((long)parser + 0x430) = puVar14 + 1;
                *puVar14 = uVar3;
                lVar19 = lVar19 + 1;
              } while (lVar19 < *(int *)(puVar18 + 5));
            }
            do {
              cVar2 = *pcVar20;
              pcVar20 = pcVar20 + 1;
            } while (cVar2 != ':');
            do {
              pcVar15 = *(char **)((long)parser + 0x430);
              if (pcVar15 == *(char **)((long)parser + 0x428)) {
                iVar9 = poolGrow(pool);
                if (iVar9 == 0) goto LAB_001510dd;
                pcVar15 = *(char **)((long)parser + 0x430);
              }
              cVar2 = *pcVar20;
              *(char **)((long)parser + 0x430) = pcVar15 + 1;
              *pcVar15 = cVar2;
              cVar2 = *pcVar20;
              pcVar20 = pcVar20 + 1;
            } while (cVar2 != '\0');
            if (*(int *)((long)parser + 0x1cc) != 0) {
              *(undefined1 *)(*(long *)((long)parser + 0x430) + -1) =
                   *(undefined1 *)((long)parser + 0x488);
              pcVar20 = *(char **)*puVar18;
              do {
                pcVar15 = *(char **)((long)parser + 0x430);
                if (pcVar15 == *(char **)((long)parser + 0x428)) {
                  iVar9 = poolGrow(pool);
                  if (iVar9 == 0) goto LAB_001510dd;
                  pcVar15 = *(char **)((long)parser + 0x430);
                }
                cVar2 = *pcVar20;
                *(char **)((long)parser + 0x430) = pcVar15 + 1;
                *pcVar15 = cVar2;
                cVar2 = *pcVar20;
                pcVar20 = pcVar20 + 1;
              } while (cVar2 != '\0');
            }
            (&pAVar10->name)[uVar22] = *(char **)((long)parser + 0x438);
            *(undefined8 *)((long)parser + 0x438) = *(undefined8 *)((long)parser + 0x430);
          }
          local_7c = local_7c + -1;
          if (local_7c == 0) break;
        }
        uVar22 = uVar22 + 2;
      } while ((int)uVar22 < iVar21);
    }
    if ((int)uVar22 < iVar21) {
      ppcVar16 = &pAVar10->name + (uVar22 & 0xffffffff);
      do {
        (*ppcVar16)[-1] = '\0';
        ppcVar16 = ppcVar16 + 2;
        uVar6 = (int)uVar22 + 2;
        uVar22 = (ulong)uVar6;
      } while ((int)uVar6 < iVar21);
    }
    if (tagNamePtr == (TAG_NAME *)0x0) {
      return XML_ERROR_NONE;
    }
    for (pBVar17 = *bindingsPtr; pBVar17 != (BINDING *)0x0; pBVar17 = pBVar17->nextTagBinding) {
      pBVar17->attId->name[-1] = '\0';
    }
    if (elementType->prefix == (PREFIX *)0x0) {
      pBVar17 = *(BINDING **)((long)parser + 0x398);
      if (pBVar17 == (BINDING *)0x0) {
        return XML_ERROR_NONE;
      }
      pcVar20 = tagNamePtr->str;
    }
    else {
      pBVar17 = elementType->prefix->binding;
      if (pBVar17 == (BINDING *)0x0) {
        return XML_ERROR_NONE;
      }
      pcVar20 = tagNamePtr->str;
      do {
        cVar2 = *pcVar20;
        pcVar20 = pcVar20 + 1;
      } while (cVar2 != ':');
    }
    tagNamePtr->localPart = pcVar20;
    iVar21 = pBVar17->uriLen;
    tagNamePtr->uriLen = iVar21;
    uVar22 = 0;
    do {
      pcVar15 = pcVar20 + uVar22;
      uVar22 = uVar22 + 1;
    } while (*pcVar15 != '\0');
    if (pBVar17->uriAlloc < iVar21 + (int)uVar22) {
      iVar21 = iVar21 + 0x18 + (int)uVar22;
      pXVar12 = (XML_Char *)(**(code **)((long)parser + 0x18))((long)iVar21);
      if (pXVar12 == (XML_Char *)0x0) goto LAB_001510dd;
      pBVar17->uriAlloc = iVar21;
      memcpy(pXVar12,pBVar17->uri,(long)pBVar17->uriLen);
      pXVar5 = pBVar17->uri;
      for (puVar18 = *(undefined8 **)((long)parser + 0x3d0); puVar18 != (undefined8 *)0x0;
          puVar18 = (undefined8 *)*puVar18) {
        if ((XML_Char *)puVar18[3] == pXVar5) {
          puVar18[3] = pXVar12;
        }
      }
      (**(code **)((long)parser + 0x28))();
      pBVar17->uri = pXVar12;
      iVar21 = pBVar17->uriLen;
    }
    else {
      pXVar12 = pBVar17->uri;
    }
    memcpy(pXVar12 + iVar21,pcVar20,uVar22 & 0xffffffff);
    tagNamePtr->str = pBVar17->uri;
    XVar8 = XML_ERROR_NONE;
  }
  return XVar8;
}

Assistant:

static enum XML_Error storeAtts(XML_Parser parser, const ENCODING *enc,
                                const char *attStr, TAG_NAME *tagNamePtr,
                                BINDING **bindingsPtr)
{
  ELEMENT_TYPE *elementType = 0;
  int nDefaultAtts = 0;
  const XML_Char **appAtts;   /* the attribute list to pass to the application */
  int attIndex = 0;
  int i;
  int n;
  int nPrefixes = 0;
  BINDING *binding;
  const XML_Char *localPart;

  /* lookup the element type name */
  if (tagNamePtr) {
    elementType = (ELEMENT_TYPE *)lookup(&dtd.elementTypes, tagNamePtr->str,0);
    if (!elementType) {
      tagNamePtr->str = poolCopyString(&dtd.pool, tagNamePtr->str);
      if (!tagNamePtr->str)
        return XML_ERROR_NO_MEMORY;
      elementType = (ELEMENT_TYPE *)lookup(&dtd.elementTypes, tagNamePtr->str, sizeof(ELEMENT_TYPE));
      if (!elementType)
        return XML_ERROR_NO_MEMORY;
      if (ns && !setElementTypePrefix(parser, elementType))
        return XML_ERROR_NO_MEMORY;
    }
    nDefaultAtts = elementType->nDefaultAtts;
  }
  /* get the attributes from the tokenizer */
  n = XmlGetAttributes(enc, attStr, attsSize, atts);
  if (n + nDefaultAtts > attsSize) {
    int oldAttsSize = attsSize;
    attsSize = n + nDefaultAtts + INIT_ATTS_SIZE;
    atts = REALLOC((void *)atts, attsSize * sizeof(ATTRIBUTE));
    if (!atts)
      return XML_ERROR_NO_MEMORY;
    if (n > oldAttsSize)
      XmlGetAttributes(enc, attStr, n, atts);
  }
  appAtts = (const XML_Char **)atts;
  for (i = 0; i < n; i++) {
    /* add the name and value to the attribute list */
    ATTRIBUTE_ID *attId = getAttributeId(parser, enc, atts[i].name,
                                         atts[i].name
                                         + XmlNameLength(enc, atts[i].name));
    if (!attId)
      return XML_ERROR_NO_MEMORY;
    /* detect duplicate attributes */
    if ((attId->name)[-1]) {
      if (enc == encoding)
        eventPtr = atts[i].name;
      return XML_ERROR_DUPLICATE_ATTRIBUTE;
    }
    (attId->name)[-1] = 1;
    appAtts[attIndex++] = attId->name;
    if (!atts[i].normalized) {
      enum XML_Error result;
      int isCdata = 1;

      /* figure out whether declared as other than CDATA */
      if (attId->maybeTokenized) {
        int j;
        for (j = 0; j < nDefaultAtts; j++) {
          if (attId == elementType->defaultAtts[j].id) {
            isCdata = elementType->defaultAtts[j].isCdata;
            break;
          }
        }
      }

      /* normalize the attribute value */
      result = storeAttributeValue(parser, enc, isCdata,
                                   atts[i].valuePtr, atts[i].valueEnd,
                                   &tempPool);
      if (result)
        return result;
      if (tagNamePtr) {
        appAtts[attIndex] = poolStart(&tempPool);
        poolFinish(&tempPool);
      }
      else
        poolDiscard(&tempPool);
    }
    else if (tagNamePtr) {
      /* the value did not need normalizing */
      appAtts[attIndex] = poolStoreString(&tempPool, enc, atts[i].valuePtr, atts[i].valueEnd);
      if (appAtts[attIndex] == 0)
        return XML_ERROR_NO_MEMORY;
      poolFinish(&tempPool);
    }
    /* handle prefixed attribute names */
    if (attId->prefix && tagNamePtr) {
      if (attId->xmlns) {
        /* deal with namespace declarations here */
        if (!addBinding(parser, attId->prefix, attId, appAtts[attIndex], bindingsPtr))
          return XML_ERROR_NO_MEMORY;
        --attIndex;
      }
      else {
        /* deal with other prefixed names later */
        attIndex++;
        nPrefixes++;
        (attId->name)[-1] = 2;
      }
    }
    else
      attIndex++;
  }
  if (tagNamePtr) {
    int j;
    nSpecifiedAtts = attIndex;
    if (elementType->idAtt && (elementType->idAtt->name)[-1]) {
      for (i = 0; i < attIndex; i += 2)
        if (appAtts[i] == elementType->idAtt->name) {
          idAttIndex = i;
          break;
        }
    }
    else
      idAttIndex = -1;
    /* do attribute defaulting */
    for (j = 0; j < nDefaultAtts; j++) {
      const DEFAULT_ATTRIBUTE *da = elementType->defaultAtts + j;
      if (!(da->id->name)[-1] && da->value) {
        if (da->id->prefix) {
          if (da->id->xmlns) {
            if (!addBinding(parser, da->id->prefix, da->id, da->value, bindingsPtr))
              return XML_ERROR_NO_MEMORY;
          }
          else {
            (da->id->name)[-1] = 2;
            nPrefixes++;
            appAtts[attIndex++] = da->id->name;
            appAtts[attIndex++] = da->value;
          }
        }
        else {
          (da->id->name)[-1] = 1;
          appAtts[attIndex++] = da->id->name;
          appAtts[attIndex++] = da->value;
        }
      }
    }
    appAtts[attIndex] = 0;
  }
  i = 0;
  if (nPrefixes) {
    /* expand prefixed attribute names */
    for (; i < attIndex; i += 2) {
      if (appAtts[i][-1] == 2) {
        ATTRIBUTE_ID *id;
        ((XML_Char *)(appAtts[i]))[-1] = 0;
        id = (ATTRIBUTE_ID *)lookup(&dtd.attributeIds, appAtts[i], 0);
        if (id->prefix->binding) {
          int j;
          const BINDING *b = id->prefix->binding;
          const XML_Char *s = appAtts[i];
          for (j = 0; j < b->uriLen; j++) {
            if (!poolAppendChar(&tempPool, b->uri[j]))
              return XML_ERROR_NO_MEMORY;
          }
          while (*s++ != ':')
            ;
          do {
            if (!poolAppendChar(&tempPool, *s))
              return XML_ERROR_NO_MEMORY;
          } while (*s++);
          if (ns_triplets) {
            tempPool.ptr[-1] = namespaceSeparator;
            s = b->prefix->name;
            do {
              if (!poolAppendChar(&tempPool, *s))
                return XML_ERROR_NO_MEMORY;
            } while (*s++);
          }

          appAtts[i] = poolStart(&tempPool);
          poolFinish(&tempPool);
        }
        if (!--nPrefixes)
          break;
      }
      else
        ((XML_Char *)(appAtts[i]))[-1] = 0;
    }
  }
  /* clear the flags that say whether attributes were specified */
  for (; i < attIndex; i += 2)
    ((XML_Char *)(appAtts[i]))[-1] = 0;
  if (!tagNamePtr)
    return XML_ERROR_NONE;
  for (binding = *bindingsPtr; binding; binding = binding->nextTagBinding)
    binding->attId->name[-1] = 0;
  /* expand the element type name */
  if (elementType->prefix) {
    binding = elementType->prefix->binding;
    if (!binding)
      return XML_ERROR_NONE;
    localPart = tagNamePtr->str;
    while (*localPart++ != XML_T(':'))
      ;
  }
  else if (dtd.defaultPrefix.binding) {
    binding = dtd.defaultPrefix.binding;
    localPart = tagNamePtr->str;
  }
  else
    return XML_ERROR_NONE;
  tagNamePtr->localPart = localPart;
  tagNamePtr->uriLen = binding->uriLen;
  for (i = 0; localPart[i++];)
    ;
  n = i + binding->uriLen;
  if (n > binding->uriAlloc) {
    TAG *p;
    XML_Char *uri = MALLOC((n + EXPAND_SPARE) * sizeof(XML_Char));
    if (!uri)
      return XML_ERROR_NO_MEMORY;
    binding->uriAlloc = n + EXPAND_SPARE;
    memcpy(uri, binding->uri, binding->uriLen * sizeof(XML_Char));
    for (p = tagStack; p; p = p->parent)
      if (p->name.str == binding->uri)
        p->name.str = uri;
    FREE(binding->uri);
    binding->uri = uri;
  }
  memcpy(binding->uri + binding->uriLen, localPart, i * sizeof(XML_Char));
  tagNamePtr->str = binding->uri;
  return XML_ERROR_NONE;
}